

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KEncodersDecoders.h
# Opt level: O0

void __thiscall KDIS::NetToDataType<unsigned_short>::SwapBytes(NetToDataType<unsigned_short> *this)

{
  ushort local_18;
  ushort local_16;
  ushort local_14;
  NetToDataType<unsigned_short> aNStack_12 [2];
  KUINT16 i_1;
  KUINT16 j;
  KUINT16 i;
  KOCTET Temp [2];
  NetToDataType<unsigned_short> *this_local;
  
  _i_1 = this;
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    aNStack_12[local_14] = this[local_14];
  }
  local_16 = 1;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    this[local_18] = aNStack_12[local_16];
    local_16 = local_16 - 1;
  }
  return;
}

Assistant:

void SwapBytes()
    {
        KOCTET Temp[sizeof( DataType )];

        // Copy Data To temp;
        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            Temp[i] = m_Octs[i];
        }

        // Now swap bytes
        KUINT16 j = ( sizeof( DataType ) ) - 1 ;

        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            m_Octs[i] = Temp[j];
            --j;
        }
    }